

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  TestInfo *pTVar1;
  bool bVar2;
  bool bVar3;
  pointer ppTVar4;
  byte bVar5;
  pointer ppTVar6;
  int iVar7;
  undefined4 in_register_00000034;
  string *filter;
  int iVar8;
  bool bVar9;
  allocator<char> local_175;
  int32_t local_174;
  int32_t local_170;
  ReactionToSharding local_16c;
  string *local_168;
  pointer local_160;
  pointer local_158;
  TestSuite *local_150;
  pointer local_148;
  UnitTestFilter disable_test_filter;
  string local_f0;
  PositiveAndNegativeUnitTestFilter gtest_flag_filter;
  
  filter = (string *)CONCAT44(in_register_00000034,shard_tests);
  local_16c = shard_tests;
  if (shard_tests == HONOR_SHARDING_PROTOCOL) {
    local_170 = Int32FromEnvOrDie("GTEST_TOTAL_SHARDS",-1);
    filter = (string *)0xffffffff;
    local_174 = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
  }
  else {
    local_174 = -1;
    local_170 = local_174;
  }
  anon_unknown_37::PositiveAndNegativeUnitTestFilter::PositiveAndNegativeUnitTestFilter
            (&gtest_flag_filter,filter);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"DISABLED_*:*/DISABLED_*",&local_175);
  anon_unknown_37::UnitTestFilter::UnitTestFilter(&disable_test_filter,&local_f0);
  std::__cxx11::string::_M_dispose();
  local_160 = (this->test_suites_).
              super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  iVar8 = 0;
  iVar7 = 0;
  ppTVar4 = (this->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while (ppTVar4 != local_160) {
    local_150 = *ppTVar4;
    local_168 = &local_150->name_;
    local_150->should_run_ = false;
    local_148 = (local_150->test_info_list_).
                super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    local_158 = ppTVar4;
    for (ppTVar6 = (local_150->test_info_list_).
                   super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppTVar6 != local_148;
        ppTVar6 = ppTVar6 + 1) {
      pTVar1 = *ppTVar6;
      bVar2 = anon_unknown_37::UnitTestFilter::MatchesName(&disable_test_filter,local_168);
      bVar3 = true;
      if (!bVar2) {
        bVar3 = anon_unknown_37::UnitTestFilter::MatchesName(&disable_test_filter,&pTVar1->name_);
      }
      pTVar1->is_disabled_ = bVar3;
      bVar2 = anon_unknown_37::PositiveAndNegativeUnitTestFilter::MatchesTest
                        (&gtest_flag_filter,local_168,&pTVar1->name_);
      pTVar1->matches_filter_ = bVar2;
      bVar9 = iVar7 % local_170 != local_174;
      bVar5 = bVar2 & (bVar3 ^ 1U | FLAGS_gtest_also_run_disabled_tests);
      pTVar1->is_in_another_shard_ = local_16c != IGNORE_SHARDING_PROTOCOL && bVar9;
      bVar2 = (bool)((local_16c == IGNORE_SHARDING_PROTOCOL || !bVar9) & bVar5);
      iVar7 = iVar7 + (uint)bVar5;
      iVar8 = iVar8 + (uint)bVar2;
      pTVar1->should_run_ = bVar2;
      local_150->should_run_ = (bool)(local_150->should_run_ | bVar2);
    }
    ppTVar4 = local_158 + 1;
  }
  anon_unknown_37::UnitTestFilter::~UnitTestFilter(&disable_test_filter);
  anon_unknown_37::PositiveAndNegativeUnitTestFilter::~PositiveAndNegativeUnitTestFilter
            (&gtest_flag_filter);
  return iVar8;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const int32_t total_shards = shard_tests == HONOR_SHARDING_PROTOCOL
                                   ? Int32FromEnvOrDie(kTestTotalShards, -1)
                                   : -1;
  const int32_t shard_index = shard_tests == HONOR_SHARDING_PROTOCOL
                                  ? Int32FromEnvOrDie(kTestShardIndex, -1)
                                  : -1;

  const PositiveAndNegativeUnitTestFilter gtest_flag_filter(
      GTEST_FLAG_GET(filter));
  const UnitTestFilter disable_test_filter(kDisableTestFilter);
  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (auto* test_suite : test_suites_) {
    const std::string& test_suite_name = test_suite->name_;
    test_suite->set_should_run(false);

    for (TestInfo* test_info : test_suite->test_info_list()) {
      const std::string& test_name = test_info->name_;
      // A test is disabled if test suite name or test name matches
      // kDisableTestFilter.
      const bool is_disabled =
          disable_test_filter.MatchesName(test_suite_name) ||
          disable_test_filter.MatchesName(test_name);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter =
          gtest_flag_filter.MatchesTest(test_suite_name, test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG_GET(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_in_another_shard =
          shard_tests != IGNORE_SHARDING_PROTOCOL &&
          !ShouldRunTestOnShard(total_shards, shard_index, num_runnable_tests);
      test_info->is_in_another_shard_ = is_in_another_shard;
      const bool is_selected = is_runnable && !is_in_another_shard;

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_suite->set_should_run(test_suite->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}